

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O1

Ref<embree::XML> __thiscall embree::XML::child(XML *this,size_t id)

{
  _func_int **pp_Var1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (in_RDX < (ulong)(*(long *)(id + 0x88) - *(long *)(id + 0x80) >> 3)) {
    pp_Var1 = *(_func_int ***)(*(long *)(id + 0x80) + in_RDX * 8);
    (this->super_RefCount)._vptr_RefCount = pp_Var1;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 0x10))();
    }
    return (Ref<embree::XML>)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_68,(ParseLocation *)(id + 0x10));
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_c8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar3) {
    local_c8.field_2._M_allocated_capacity = *psVar3;
    local_c8.field_2._8_8_ = plVar2[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar3;
  }
  local_c8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_88,in_RDX);
  std::operator+(&local_48,&local_c8,&local_88);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_a8 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_a8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Ref<XML> child(const size_t id) const 
    {
      if (id >= children.size()) 
        THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + toString(id) + "\"");
      return children[id];
    }